

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

bool __thiscall
clickhouse::ColumnString::Load(ColumnString *this,CodedInputStream *input,size_t rows)

{
  bool bVar1;
  ulong in_RDX;
  string s;
  size_t i;
  value_type *in_stack_ffffffffffffff88;
  string *value;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  string local_48;
  ulong local_28;
  ulong local_20;
  byte local_1;
  
  local_20 = in_RDX;
  for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
    value = &local_48;
    std::__cxx11::string::string((string *)value);
    bVar1 = WireFormat::ReadString
                      ((CodedInputStream *)
                       CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),value);
    in_stack_ffffffffffffff9f = bVar1;
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)value,in_stack_ffffffffffffff88);
    }
    else {
      local_1 = 0;
    }
    std::__cxx11::string::~string((string *)&local_48);
    if (!bVar1) goto LAB_0023600a;
  }
  local_1 = 1;
LAB_0023600a:
  return (bool)(local_1 & 1);
}

Assistant:

bool ColumnString::Load(CodedInputStream* input, size_t rows) {
    for (size_t i = 0; i < rows; ++i) {
        std::string s;

        if (!WireFormat::ReadString(input, &s)) {
            return false;
        }

        data_.push_back(std::move(s));
    }

    return true;
}